

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

FaceHandle __thiscall
OpenMesh::PolyConnectivity::add_face
          (PolyConnectivity *this,VertexHandle *_vertex_handles,size_t _vhs_size)

{
  pointer *ppFVar1;
  BaseHandle BVar2;
  VertexHandle _vh;
  pointer ppVar3;
  iterator __position;
  pointer ppBVar4;
  BaseProperty *pBVar5;
  bool bVar6;
  BaseHandle BVar7;
  int iVar8;
  FaceHandle _fh;
  uint uVar9;
  Halfedge *pHVar10;
  undefined4 extraout_var;
  Face *pFVar11;
  Vertex *pVVar12;
  pointer pAVar13;
  mostream *pmVar14;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  char *pcVar18;
  VertexHandle *pVVar19;
  BaseHandle BVar20;
  size_t sVar21;
  ulong uVar22;
  pointer ppBVar23;
  Face local_5c;
  size_t local_58;
  vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  *local_50;
  VertexHandle *local_48;
  BaseHandle local_40;
  BaseHandle local_3c;
  BaseHandle local_38;
  BaseHandle local_34;
  
  local_50 = &this->edgeData_;
  if ((ulong)((long)(this->edgeData_).
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->edgeData_).
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) < _vhs_size) {
    std::
    vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
    ::resize(local_50,_vhs_size);
    std::
    vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
    ::resize(&this->next_cache_,_vhs_size * 6);
  }
  this->next_cache_count_ = 0;
  if (_vhs_size < 3) {
    __assert_fail("n > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x86,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                 );
  }
  sVar16 = 1;
  sVar21 = 0;
  while( true ) {
    bVar6 = is_boundary(this,(VertexHandle)_vertex_handles[sVar21].super_BaseHandle.idx_);
    if (!bVar6) {
      pmVar14 = omerr();
      pcVar18 = "PolyMeshT::add_face: complex vertex\n";
      lVar15 = 0x24;
      goto LAB_0018f337;
    }
    BVar7.idx_ = (int)find_halfedge(this,_vertex_handles[sVar21].super_BaseHandle.idx_,
                                    _vertex_handles[sVar16].super_BaseHandle.idx_);
    (this->edgeData_).
    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
    ._M_impl.super__Vector_impl_data._M_start[sVar21].halfedge_handle.super_BaseHandle.idx_ =
         BVar7.idx_;
    pAVar13 = (this->edgeData_).
              super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    BVar7.idx_ = pAVar13[sVar21].halfedge_handle.super_BaseHandle.idx_;
    pAVar13[sVar21].is_new = BVar7.idx_ == -1;
    pAVar13[sVar21].needs_adjust = false;
    if ((BVar7.idx_ != -1) &&
       (pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar7.idx_),
       (pHVar10->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1)) break;
    sVar21 = sVar21 + 1;
    sVar16 = sVar16 + 1;
    if (sVar16 == _vhs_size) {
      sVar16 = 0;
    }
    if (_vhs_size == sVar21) {
      uVar22 = 1;
      uVar17 = 0;
      local_58 = _vhs_size;
      local_48 = _vertex_handles;
      do {
        pAVar13 = (local_50->
                  super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((pAVar13[uVar17].is_new == false) && (pAVar13[uVar22].is_new == false)) {
          local_40.idx_ = pAVar13[uVar17].halfedge_handle.super_BaseHandle.idx_;
          BVar7.idx_ = pAVar13[uVar22].halfedge_handle.super_BaseHandle.idx_;
          pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)local_40.idx_);
          BVar2.idx_ = local_40.idx_;
          if ((pHVar10->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_ !=
              BVar7.idx_) {
            BVar20.idx_ = (-(BVar7.idx_ & 1U) | 1) + BVar7.idx_;
            local_38.idx_ = BVar7.idx_;
            do {
              do {
                pHVar10 = ArrayKernel::halfedge
                                    (&this->super_ArrayKernel,(HalfedgeHandle)BVar20.idx_);
                uVar9 = (pHVar10->super_Halfedge_without_prev).next_halfedge_handle_.
                        super_BaseHandle.idx_;
                BVar20.idx_ = (-(uVar9 & 1) | 1) + uVar9;
                pHVar10 = ArrayKernel::halfedge
                                    (&this->super_ArrayKernel,(HalfedgeHandle)BVar20.idx_);
              } while ((pHVar10->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ !=
                       -1);
            } while (BVar20.idx_ == BVar2.idx_);
            pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar20.idx_);
            local_34.idx_ =
                 (pHVar10->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
            pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar20.idx_);
            if ((pHVar10->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1) {
              __assert_fail("is_boundary(boundary_prev)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xb5,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)local_34.idx_);
            if ((pHVar10->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ != -1) {
              __assert_fail("is_boundary(boundary_next)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xb6,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (local_34.idx_ == local_38.idx_) {
              pmVar14 = omerr();
              pcVar18 = "PolyMeshT::add_face: patch re-linking failed\n";
              lVar15 = 0x2d;
LAB_0018f337:
              std::__ostream_insert<char,std::char_traits<char>>
                        (&pmVar14->super_ostream,pcVar18,lVar15);
              return (FaceHandle)InvalidFaceHandle;
            }
            pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar2.idx_);
            local_3c.idx_ =
                 (pHVar10->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_;
            pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)local_38.idx_);
            if (BVar20.idx_ == -1) {
              __assert_fail("boundary_prev.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc2,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (local_3c.idx_ == -1) {
              __assert_fail("patch_start.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc3,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            BVar7.idx_ = (pHVar10->prev_halfedge_handle_).super_BaseHandle.idx_;
            if (BVar7.idx_ == -1) {
              __assert_fail("patch_end.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc4,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (local_34.idx_ == 0xffffffff) {
              __assert_fail("boundary_next.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc5,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (BVar2.idx_ == -1) {
              __assert_fail("inner_prev.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xc6,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            if (local_38.idx_ == 0xffffffff) {
              __assert_fail("inner_next.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,199,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            uVar9 = this->next_cache_count_;
            this->next_cache_count_ = uVar9 + 1;
            ppVar3 = (this->next_cache_).
                     super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar3[uVar9].first.super_BaseHandle.idx_ = BVar20.idx_;
            ppVar3[uVar9].second.super_BaseHandle.idx_ = local_3c.idx_;
            uVar9 = this->next_cache_count_;
            this->next_cache_count_ = uVar9 + 1;
            ppVar3 = (this->next_cache_).
                     super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar3[uVar9].first.super_BaseHandle.idx_ = BVar7.idx_;
            ppVar3[uVar9].second.super_BaseHandle.idx_ = local_34.idx_;
            uVar9 = this->next_cache_count_;
            this->next_cache_count_ = uVar9 + 1;
            ppVar3 = (this->next_cache_).
                     super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar3[uVar9].first.super_BaseHandle.idx_ = BVar2.idx_;
            ppVar3[uVar9].second.super_BaseHandle.idx_ = local_38.idx_;
            _vhs_size = local_58;
          }
        }
        pVVar19 = local_48;
        uVar17 = uVar17 + 1;
        uVar22 = (uVar22 + 1) % _vhs_size;
        if (uVar17 == _vhs_size) {
          uVar22 = 1;
          uVar17 = 0;
          do {
            if ((local_50->
                super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar17].is_new == true) {
              BVar7.idx_ = (int)ArrayKernel::new_edge
                                          (&this->super_ArrayKernel,
                                           pVVar19[uVar17].super_BaseHandle.idx_,
                                           pVVar19[uVar22].super_BaseHandle.idx_);
              (this->edgeData_).
              super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar17].halfedge_handle.super_BaseHandle.
              idx_ = BVar7.idx_;
            }
            uVar17 = uVar17 + 1;
            uVar22 = (uVar22 + 1) % _vhs_size;
          } while (_vhs_size != uVar17);
          local_5c.halfedge_handle_.super_BaseHandle.idx_ = (HalfedgeHandle)(BaseHandle)0xffffffff;
          __position._M_current =
               (this->super_ArrayKernel).faces_.
               super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->super_ArrayKernel).faces_.
              super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
            _M_realloc_insert<OpenMesh::ArrayItems::Face>
                      (&(this->super_ArrayKernel).faces_,__position,&local_5c);
          }
          else {
            ((__position._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
            ppFVar1 = &(this->super_ArrayKernel).faces_.
                       super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppFVar1 = *ppFVar1 + 1;
          }
          iVar8 = (*(this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])(this);
          ppBVar4 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                    super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppBVar23 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                          super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppBVar23 != ppBVar4;
              ppBVar23 = ppBVar23 + 1) {
            pBVar5 = *ppBVar23;
            if (pBVar5 != (BaseProperty *)0x0) {
              (*pBVar5->_vptr_BaseProperty[3])(pBVar5,CONCAT44(extraout_var,iVar8));
            }
          }
          _fh = ArrayKernel::handle(&this->super_ArrayKernel,
                                    (this->super_ArrayKernel).faces_.
                                    super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1);
          BVar7.idx_ = (this->edgeData_).
                       super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start[_vhs_size - 1].halfedge_handle.
                       super_BaseHandle.idx_;
          pFVar11 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.super_BaseHandle.idx_
                                     );
          (pFVar11->halfedge_handle_).super_BaseHandle.idx_ = BVar7.idx_;
          uVar22 = 1;
          uVar17 = 0;
          pVVar19 = local_48;
          local_3c = _fh.super_BaseHandle.idx_;
          do {
            pAVar13 = (local_50->
                      super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            BVar7.idx_ = pAVar13[uVar17].halfedge_handle.super_BaseHandle.idx_;
            if (BVar7.idx_ == -1) {
              __assert_fail("inner_prev.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xe1,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            BVar2.idx_ = pAVar13[uVar22].halfedge_handle.super_BaseHandle.idx_;
            if (BVar2.idx_ == -1) {
              __assert_fail("inner_next.is_valid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                            ,0xe2,
                            "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                           );
            }
            _vh.super_BaseHandle.idx_ = (BaseHandle)pVVar19[uVar22].super_BaseHandle.idx_;
            uVar9 = pAVar13[uVar17].is_new + 2;
            if (pAVar13[uVar22].is_new == false) {
              uVar9 = (uint)pAVar13[uVar17].is_new;
            }
            if (uVar9 == 0) {
              pVVar12 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
              pAVar13 = (this->edgeData_).
                        super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pAVar13[uVar22].needs_adjust =
                   (pVVar12->halfedge_handle_).super_BaseHandle.idx_ == BVar2.idx_;
            }
            else {
              BVar20.idx_ = (-(BVar2.idx_ & 1U) | 1) + BVar2.idx_;
              if (BVar20.idx_ == -1) {
                __assert_fail("outer_prev.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0xed,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              iVar8 = (-(BVar7.idx_ & 1U) | 1) + BVar7.idx_;
              if (iVar8 == -1) {
                __assert_fail("outer_next.is_valid()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                              ,0xee,
                              "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                             );
              }
              local_40.idx_ = BVar2.idx_;
              local_38.idx_ = BVar7.idx_;
              local_34.idx_ = (int)_vh.super_BaseHandle.idx_;
              if (uVar9 == 3) {
                pVVar12 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
                if ((pVVar12->halfedge_handle_).super_BaseHandle.idx_ == -1) {
                  pVVar12 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_
                                               );
                  (pVVar12->halfedge_handle_).super_BaseHandle.idx_ = iVar8;
                  uVar9 = this->next_cache_count_;
                  this->next_cache_count_ = uVar9 + 1;
                  ppVar3 = (this->next_cache_).
                           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar3[uVar9].first.super_BaseHandle.idx_ = BVar20.idx_;
                  ppVar3[uVar9].second.super_BaseHandle.idx_ = iVar8;
                  pVVar19 = local_48;
                }
                else {
                  pVVar12 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_
                                               );
                  local_34.idx_ = (pVVar12->halfedge_handle_).super_BaseHandle.idx_;
                  pHVar10 = ArrayKernel::halfedge
                                      (&this->super_ArrayKernel,(HalfedgeHandle)local_34.idx_);
                  BVar7.idx_ = (pHVar10->prev_halfedge_handle_).super_BaseHandle.idx_;
                  if (BVar7.idx_ == -1) {
                    __assert_fail("boundary_prev.is_valid()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                                  ,0x10b,
                                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                                 );
                  }
                  if (local_34.idx_ == 0xffffffff) {
                    __assert_fail("boundary_next.is_valid()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                                  ,0x10c,
                                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                                 );
                  }
                  uVar9 = this->next_cache_count_;
                  this->next_cache_count_ = uVar9 + 1;
                  ppVar3 = (this->next_cache_).
                           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar3[uVar9].first.super_BaseHandle.idx_ = BVar7.idx_;
                  ppVar3[uVar9].second.super_BaseHandle.idx_ = iVar8;
                  uVar9 = this->next_cache_count_;
                  this->next_cache_count_ = uVar9 + 1;
                  ppVar3 = (this->next_cache_).
                           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar3[uVar9].first.super_BaseHandle.idx_ = BVar20.idx_;
                  ppVar3[uVar9].second.super_BaseHandle.idx_ = local_34.idx_;
                  pVVar19 = local_48;
                }
              }
              else if (uVar9 == 2) {
                pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar7.idx_)
                ;
                iVar8 = (pHVar10->super_Halfedge_without_prev).next_halfedge_handle_.
                        super_BaseHandle.idx_;
                if (iVar8 == -1) {
                  __assert_fail("boundary_next.is_valid()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                                ,0xfc,
                                "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                               );
                }
                uVar9 = this->next_cache_count_;
                this->next_cache_count_ = uVar9 + 1;
                ppVar3 = (this->next_cache_).
                         super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar3[uVar9].first.super_BaseHandle.idx_ = BVar20.idx_;
                ppVar3[uVar9].second.super_BaseHandle.idx_ = iVar8;
                pVVar12 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
                (pVVar12->halfedge_handle_).super_BaseHandle.idx_ = iVar8;
                pVVar19 = local_48;
              }
              else {
                pHVar10 = ArrayKernel::halfedge(&this->super_ArrayKernel,(HalfedgeHandle)BVar2.idx_)
                ;
                pVVar19 = local_48;
                BVar7.idx_ = (pHVar10->prev_halfedge_handle_).super_BaseHandle.idx_;
                if (BVar7.idx_ == -1) {
                  __assert_fail("boundary_prev.is_valid()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                                ,0xf5,
                                "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::add_face(const VertexHandle *, size_t)"
                               );
                }
                uVar9 = this->next_cache_count_;
                this->next_cache_count_ = uVar9 + 1;
                ppVar3 = (this->next_cache_).
                         super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ppVar3[uVar9].first.super_BaseHandle.idx_ = BVar7.idx_;
                ppVar3[uVar9].second.super_BaseHandle.idx_ = iVar8;
                pVVar12 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)local_34.idx_);
                (pVVar12->halfedge_handle_).super_BaseHandle.idx_ = iVar8;
              }
              uVar9 = this->next_cache_count_;
              this->next_cache_count_ = uVar9 + 1;
              ppVar3 = (this->next_cache_).
                       super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar3[uVar9].first.super_BaseHandle.idx_ = local_38.idx_;
              ppVar3[uVar9].second.super_BaseHandle.idx_ = local_40.idx_;
              pAVar13 = (this->edgeData_).
                        super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            BVar7.idx_ = local_3c.idx_;
            pHVar10 = ArrayKernel::halfedge
                                (&this->super_ArrayKernel,
                                 (HalfedgeHandle)
                                 pAVar13[uVar17].halfedge_handle.super_BaseHandle.idx_);
            (pHVar10->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = BVar7.idx_;
            uVar17 = uVar17 + 1;
            uVar22 = (uVar22 + 1) % local_58;
            if (local_58 == uVar17) {
              if (this->next_cache_count_ != 0) {
                uVar22 = 0;
                do {
                  ppVar3 = (this->next_cache_).
                           super__Vector_base<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ArrayKernel::set_next_halfedge_handle
                            (&this->super_ArrayKernel,
                             (HalfedgeHandle)ppVar3[uVar22].first.super_BaseHandle.idx_,
                             (HalfedgeHandle)ppVar3[uVar22].second.super_BaseHandle.idx_);
                  uVar22 = uVar22 + 1;
                } while (uVar22 < this->next_cache_count_);
              }
              sVar16 = local_58;
              uVar22 = 0;
              do {
                if ((local_50->
                    super__Vector_base<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar22].needs_adjust == true) {
                  adjust_outgoing_halfedge(this,(VertexHandle)pVVar19[uVar22].super_BaseHandle.idx_)
                  ;
                }
                uVar22 = uVar22 + 1;
              } while (sVar16 != uVar22);
              return (BaseHandle)(BaseHandle)local_3c.idx_;
            }
          } while( true );
        }
      } while( true );
    }
  }
  pmVar14 = omerr();
  pcVar18 = "PolyMeshT::add_face: complex edge\n";
  lVar15 = 0x22;
  goto LAB_0018f337;
}

Assistant:

PolyConnectivity::FaceHandle
PolyConnectivity::add_face(const VertexHandle* _vertex_handles, size_t _vhs_size)
{
  VertexHandle                   vh;
  size_t                         i, ii, n(_vhs_size);
  HalfedgeHandle                 inner_next, inner_prev,
                                 outer_next, outer_prev,
                                 boundary_next, boundary_prev,
                                 patch_start, patch_end;


  // Check sufficient working storage available
  if (edgeData_.size() < n)
  {
    edgeData_.resize(n);
    next_cache_.resize(6*n);
  }
  next_cache_count_ = 0;

  // don't allow degenerated faces
  assert (n > 2);

  // test for topological errors
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    if ( !is_boundary(_vertex_handles[i]) )
    {
      omerr() << "PolyMeshT::add_face: complex vertex\n";
      return InvalidFaceHandle;
    }

    // Initialise edge attributes
    edgeData_[i].halfedge_handle = find_halfedge(_vertex_handles[i],
                                                 _vertex_handles[ii]);
    edgeData_[i].is_new = !edgeData_[i].halfedge_handle.is_valid();
    edgeData_[i].needs_adjust = false;

    if (!edgeData_[i].is_new && !is_boundary(edgeData_[i].halfedge_handle))
    {
      omerr() << "PolyMeshT::add_face: complex edge\n";
      return InvalidFaceHandle;
    }
  }

  // re-link patches if necessary
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    if (!edgeData_[i].is_new && !edgeData_[ii].is_new)
    {
      inner_prev = edgeData_[i].halfedge_handle;
      inner_next = edgeData_[ii].halfedge_handle;


      if (next_halfedge_handle(inner_prev) != inner_next)
      {
        // here comes the ugly part... we have to relink a whole patch

        // search a free gap
        // free gap will be between boundary_prev and boundary_next
        outer_prev = opposite_halfedge_handle(inner_next);
        outer_next = opposite_halfedge_handle(inner_prev);
        boundary_prev = outer_prev;
        do
          boundary_prev =
            opposite_halfedge_handle(next_halfedge_handle(boundary_prev));
        while (!is_boundary(boundary_prev) || boundary_prev==inner_prev);
        boundary_next = next_halfedge_handle(boundary_prev);
        assert(is_boundary(boundary_prev));
        assert(is_boundary(boundary_next));
        // ok ?
        if (boundary_next == inner_next)
        {
          omerr() << "PolyMeshT::add_face: patch re-linking failed\n";
          return InvalidFaceHandle;
        }

        // other halfedges' handles
        patch_start = next_halfedge_handle(inner_prev);
        patch_end   = prev_halfedge_handle(inner_next);

        assert(boundary_prev.is_valid());
        assert(patch_start.is_valid());
        assert(patch_end.is_valid());
        assert(boundary_next.is_valid());
        assert(inner_prev.is_valid());
        assert(inner_next.is_valid());

        // relink
        next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, patch_start);
        next_cache_[next_cache_count_++] = std::make_pair(patch_end, boundary_next);
        next_cache_[next_cache_count_++] = std::make_pair(inner_prev, inner_next);
      }
    }
  }

  // create missing edges
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
    if (edgeData_[i].is_new)
      edgeData_[i].halfedge_handle = new_edge(_vertex_handles[i], _vertex_handles[ii]);

  // create the face
  FaceHandle fh(new_face());
  set_halfedge_handle(fh, edgeData_[n-1].halfedge_handle);

  // setup halfedges
  for (i=0, ii=1; i<n; ++i, ++ii, ii%=n)
  {
    vh         = _vertex_handles[ii];

    inner_prev = edgeData_[i].halfedge_handle;
    inner_next = edgeData_[ii].halfedge_handle;
    assert(inner_prev.is_valid());
    assert(inner_next.is_valid());

    size_t id = 0;
    if (edgeData_[i].is_new)  id |= 1;
    if (edgeData_[ii].is_new) id |= 2;


    if (id)
    {
      outer_prev = opposite_halfedge_handle(inner_next);
      outer_next = opposite_halfedge_handle(inner_prev);
      assert(outer_prev.is_valid());
      assert(outer_next.is_valid());

      // set outer links
      switch (id)
      {
        case 1: // prev is new, next is old
          boundary_prev = prev_halfedge_handle(inner_next);
          assert(boundary_prev.is_valid());
          next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, outer_next);
          set_halfedge_handle(vh, outer_next);
          break;

        case 2: // next is new, prev is old
          boundary_next = next_halfedge_handle(inner_prev);
          assert(boundary_next.is_valid());
          next_cache_[next_cache_count_++] = std::make_pair(outer_prev, boundary_next);
          set_halfedge_handle(vh, boundary_next);
          break;

        case 3: // both are new
          if (!halfedge_handle(vh).is_valid())
          {
            set_halfedge_handle(vh, outer_next);
            next_cache_[next_cache_count_++] = std::make_pair(outer_prev, outer_next);
          }
          else
          {
            boundary_next = halfedge_handle(vh);
            boundary_prev = prev_halfedge_handle(boundary_next);
            assert(boundary_prev.is_valid());
            assert(boundary_next.is_valid());
            next_cache_[next_cache_count_++] = std::make_pair(boundary_prev, outer_next);
            next_cache_[next_cache_count_++] = std::make_pair(outer_prev, boundary_next);
          }
          break;
      }

      // set inner link
      next_cache_[next_cache_count_++] = std::make_pair(inner_prev, inner_next);
    }
    else edgeData_[ii].needs_adjust = (halfedge_handle(vh) == inner_next);


    // set face handle
    set_face_handle(edgeData_[i].halfedge_handle, fh);
  }

  // process next halfedge cache
  for (i = 0; i < next_cache_count_; ++i)
    set_next_halfedge_handle(next_cache_[i].first, next_cache_[i].second);


  // adjust vertices' halfedge handle
  for (i=0; i<n; ++i)
    if (edgeData_[i].needs_adjust)
      adjust_outgoing_halfedge(_vertex_handles[i]);

  return fh;
}